

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.cpp
# Opt level: O1

int __thiscall
QMessageDialogOptions::clone
          (QMessageDialogOptions *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *piVar1;
  undefined8 uVar2;
  DestroyerFn p_Var3;
  Data *pDVar4;
  long in_FS_OFFSET;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined> result;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.value.ptr = (MessageDialogCombined *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar4 = (Data *)operator_new(0xe8);
  pDVar4->destroyer =
       QtSharedPointer::
       ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::noDeleter;
  (pDVar4->strongref)._q_value.super___atomic_base<int>._M_i = 1;
  (pDVar4->weakref)._q_value.super___atomic_base<int>._M_i = 1;
  piVar1 = *(int **)(__fn + -0xd0);
  *(int **)(pDVar4 + 1) = piVar1;
  pDVar4[1].destroyer = *(DestroyerFn *)(__fn + -200);
  uVar2 = *(undefined8 *)(__fn + -0xc0);
  pDVar4[2].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[2].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *(undefined4 *)&pDVar4[2].destroyer = *(undefined4 *)(__fn + -0xb8);
  piVar1 = *(int **)(__fn + -0xb0);
  *(int **)(pDVar4 + 3) = piVar1;
  pDVar4[3].destroyer = *(DestroyerFn *)(__fn + -0xa8);
  uVar2 = *(undefined8 *)(__fn + -0xa0);
  pDVar4[4].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[4].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  p_Var3 = *(DestroyerFn *)(__fn + -0x98);
  pDVar4[4].destroyer = p_Var3;
  uVar2 = *(undefined8 *)(__fn + -0x90);
  pDVar4[5].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[5].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  pDVar4[5].destroyer = *(DestroyerFn *)(__fn + -0x88);
  if (p_Var3 != (DestroyerFn)0x0) {
    LOCK();
    *(int *)p_Var3 = *(int *)p_Var3 + 1;
    UNLOCK();
  }
  piVar1 = *(int **)(__fn + -0x80);
  *(int **)(pDVar4 + 6) = piVar1;
  pDVar4[6].destroyer = *(DestroyerFn *)(__fn + -0x78);
  uVar2 = *(undefined8 *)(__fn + -0x70);
  pDVar4[7].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[7].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *(undefined4 *)&pDVar4[7].destroyer = *(undefined4 *)(__fn + -0x68);
  piVar1 = *(int **)(__fn + -0x60);
  *(int **)(pDVar4 + 8) = piVar1;
  pDVar4[8].destroyer = *(DestroyerFn *)(__fn + -0x58);
  uVar2 = *(undefined8 *)(__fn + -0x50);
  pDVar4[9].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[9].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  *(undefined4 *)&pDVar4[9].destroyer = *(undefined4 *)(__fn + -0x48);
  local_38.d = pDVar4;
  QPixmap::QPixmap((QPixmap *)(pDVar4 + 10),(QPixmap *)(__fn + -0x40));
  p_Var3 = *(DestroyerFn *)(__fn + -0x28);
  pDVar4[0xb].destroyer = p_Var3;
  uVar2 = *(undefined8 *)(__fn + -0x20);
  pDVar4[0xc].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[0xc].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  pDVar4[0xc].destroyer = *(DestroyerFn *)(__fn + -0x18);
  if (p_Var3 != (DestroyerFn)0x0) {
    LOCK();
    *(int *)p_Var3 = *(int *)p_Var3 + 1;
    UNLOCK();
  }
  uVar2 = *(undefined8 *)(__fn + -0x10);
  p_Var3 = *(DestroyerFn *)(__fn + -8);
  pDVar4[0xd].weakref = (QBasicAtomicInt)(int)uVar2;
  pDVar4[0xd].strongref = (QBasicAtomicInt)(int)((ulong)uVar2 >> 0x20);
  pDVar4[0xd].destroyer = p_Var3;
  *(Data **)(pDVar4 + 0xe) = pDVar4 + 1;
  (local_38.d)->destroyer =
       QtSharedPointer::
       ExternalRefCountWithContiguousData<(anonymous_namespace)::MessageDialogCombined>::deleter;
  *(Data **)this = pDVar4 + 0xe;
  *(Data **)(this + 8) = local_38.d;
  local_38.value.ptr = (MessageDialogCombined *)0x0;
  local_38.d = (Data *)0x0;
  QSharedPointer<(anonymous_namespace)::MessageDialogCombined>::~QSharedPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QSharedPointer<QMessageDialogOptions> QMessageDialogOptions::clone() const
{
    return QSharedPointer<MessageDialogCombined>::create(*static_cast<const MessageDialogCombined*>(this));
}